

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void SequentializeParallelCopy(VmModule *module,VmInstruction *p)

{
  int iVar1;
  VmValue **ppVVar2;
  VmValue *pVVar3;
  char *pcVar4;
  uint uVar5;
  VmInstruction *pVVar6;
  VmInstruction *replacement;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  VmValue *pVVar11;
  uint uVar12;
  VmValue *pVVar13;
  bool bVar14;
  bool bVar15;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmValue *in_stack_ffffffffffffffa8;
  ulong local_48;
  ulong uVar7;
  
  uVar5 = (p->arguments).count;
  do {
    if (uVar5 == 0) {
      return;
    }
    uVar5 = (p->arguments).count;
    uVar7 = 0;
    local_48 = uVar7;
    if (uVar5 != 0) {
      local_48 = 0;
      do {
        ppVVar2 = (p->arguments).data;
        uVar9 = (uint)uVar7;
        pVVar13 = ppVVar2[uVar7];
        if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 2)) {
          pVVar13 = (VmValue *)0x0;
        }
        uVar12 = uVar9 + 1;
        if (uVar5 <= uVar12) goto LAB_00291555;
        pVVar11 = ppVVar2[uVar12];
        if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
          pVVar11 = (VmValue *)0x0;
        }
        iVar1 = *(int *)(pVVar11[1].users.little + 7);
        if ((iVar1 == 0) || (iVar1 != *(int *)(pVVar13[1].users.little + 7))) {
          bVar15 = false;
        }
        else {
          anon_unknown.dwarf_233176::ReplaceValueUsersWith(module,pVVar13,pVVar11,(uint *)0x0);
          bVar15 = true;
        }
        if ((!bVar15) && (*(int *)(pVVar13[1].users.little + 7) == 0)) {
          type.structType = (TypeBase *)0x4f;
          type._0_8_ = (pVVar11->type).structType;
          pVVar6 = anon_unknown.dwarf_233176::CreateInstruction
                             ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,
                              *(SynBase **)&pVVar11->type,type,(VmInstructionType)pVVar11,
                              (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                              in_stack_ffffffffffffffa8);
          pcVar4 = (pVVar13->comment).end;
          (pVVar6->super_VmValue).comment.begin = (pVVar13->comment).begin;
          (pVVar6->super_VmValue).comment.end = pcVar4;
          anon_unknown.dwarf_233176::ReplaceValueUsersWith
                    (module,pVVar13,&pVVar6->super_VmValue,(uint *)0x0);
          bVar15 = true;
        }
        if ((!bVar15) && (iVar1 = *(int *)(pVVar13[1].users.little + 7), iVar1 != 0)) {
          uVar5 = (p->arguments).count;
          if (uVar5 != 0) {
            uVar8 = 2;
            do {
              if (uVar5 <= uVar8 - 1) goto LAB_00291555;
              bVar10 = false;
              if (*(int *)((p->arguments).data[uVar8 - 1][1].users.little + 7) == iVar1) {
                bVar10 = true;
                break;
              }
              bVar14 = uVar8 < uVar5;
              uVar8 = uVar8 + 2;
            } while (bVar14);
            if (bVar10) goto LAB_00291288;
          }
          type_00.structType = (TypeBase *)0x4f;
          type_00._0_8_ = (pVVar11->type).structType;
          pVVar6 = anon_unknown.dwarf_233176::CreateInstruction
                             ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,
                              *(SynBase **)&pVVar11->type,type_00,(VmInstructionType)pVVar11,
                              (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                              in_stack_ffffffffffffffa8);
          pVVar6->color = *(uint *)(pVVar13[1].users.little + 7);
          pcVar4 = (pVVar13->comment).end;
          (pVVar6->super_VmValue).comment.begin = (pVVar13->comment).begin;
          (pVVar6->super_VmValue).comment.end = pcVar4;
          anon_unknown.dwarf_233176::ReplaceValueUsersWith
                    (module,pVVar13,&pVVar6->super_VmValue,(uint *)0x0);
          bVar15 = true;
        }
LAB_00291288:
        if (bVar15) {
          if (((p->arguments).count <= uVar9) ||
             (VmValue::RemoveUse((p->arguments).data[uVar7],&p->super_VmValue),
             (p->arguments).count <= uVar12)) goto LAB_00291555;
          VmValue::RemoveUse((p->arguments).data[uVar12],&p->super_VmValue);
          uVar5 = (p->arguments).count;
          if (uVar5 == 0) goto LAB_00291574;
          if (uVar5 <= uVar12) goto LAB_00291555;
          ppVVar2 = (p->arguments).data;
          uVar8 = uVar5 - 1;
          ppVVar2[uVar12] = ppVVar2[uVar8];
          (p->arguments).count = uVar8;
          if (uVar8 == 0) goto LAB_00291574;
          if (uVar8 <= uVar9) goto LAB_00291555;
          ppVVar2 = (p->arguments).data;
          ppVVar2[uVar7] = ppVVar2[uVar5 - 2];
          (p->arguments).count = uVar5 - 2;
          local_48 = 1;
        }
        else {
          uVar7 = (ulong)(uVar9 + 2);
        }
        uVar5 = (p->arguments).count;
      } while ((uint)uVar7 < uVar5);
    }
    if (local_48 == 0) {
      if (uVar5 == 0) {
LAB_00291555:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                     );
      }
      ppVVar2 = (p->arguments).data;
      pVVar13 = *ppVVar2;
      if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 2)) {
        pVVar13 = (VmValue *)0x0;
      }
      if (uVar5 == 1) goto LAB_00291555;
      pVVar11 = ppVVar2[1];
      if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
        pVVar11 = (VmValue *)0x0;
      }
      uVar9 = 2;
      do {
        if (uVar5 <= uVar9 - 1) goto LAB_00291555;
        pVVar3 = ppVVar2[uVar9 - 1];
      } while ((*(int *)(pVVar3[1].users.little + 7) != *(int *)(pVVar13[1].users.little + 7)) &&
              (bVar15 = uVar9 < uVar5, uVar9 = uVar9 + 2, pVVar3 = (VmValue *)0x0, bVar15));
      type_01.structType = (TypeBase *)0x4f;
      type_01._0_8_ = (pVVar3->type).structType;
      pVVar6 = anon_unknown.dwarf_233176::CreateInstruction
                         ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,
                          *(SynBase **)&pVVar3->type,type_01,(VmInstructionType)pVVar3,
                          (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                          in_stack_ffffffffffffffa8);
      pcVar4 = (pVVar3->comment).end;
      (pVVar6->super_VmValue).comment.begin = (pVVar3->comment).begin;
      (pVVar6->super_VmValue).comment.end = pcVar4;
      type_02.structType = (TypeBase *)0x4f;
      type_02._0_8_ = (pVVar11->type).structType;
      replacement = anon_unknown.dwarf_233176::CreateInstruction
                              ((anon_unknown_dwarf_233176 *)module,(VmModule *)0x0,
                               *(SynBase **)&pVVar11->type,type_02,(VmInstructionType)pVVar11,
                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                               in_stack_ffffffffffffffa8);
      replacement->color = *(uint *)(pVVar13[1].users.little + 7);
      pcVar4 = (pVVar13->comment).end;
      (replacement->super_VmValue).comment.begin = (pVVar13->comment).begin;
      (replacement->super_VmValue).comment.end = pcVar4;
      anon_unknown.dwarf_233176::ReplaceValueUsersWith
                (module,pVVar13,&replacement->super_VmValue,(uint *)0x0);
      if (((p->arguments).count == 0) ||
         (VmValue::RemoveUse(*(p->arguments).data,&p->super_VmValue), (p->arguments).count < 2))
      goto LAB_00291555;
      VmValue::RemoveUse((p->arguments).data[1],&p->super_VmValue);
      uVar5 = (p->arguments).count;
      if (uVar5 == 1) goto LAB_00291555;
      if (uVar5 == 0) {
LAB_00291574:
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x172,"T &SmallArray<VmValue *, 4>::back() [T = VmValue *, N = 4]");
      }
      ppVVar2 = (p->arguments).data;
      uVar9 = uVar5 - 1;
      ppVVar2[1] = ppVVar2[uVar9];
      (p->arguments).count = uVar9;
      if (uVar9 == 0) goto LAB_00291574;
      ppVVar2 = (p->arguments).data;
      uVar5 = uVar5 - 2;
      uVar7 = (ulong)uVar5;
      *ppVVar2 = ppVVar2[uVar7];
      (p->arguments).count = uVar5;
      if (uVar5 != 0) {
        uVar5 = 0;
        do {
          uVar9 = uVar5 + 1;
          if ((uint)uVar7 <= uVar9) goto LAB_00291555;
          ppVVar2 = (p->arguments).data;
          pVVar11 = ppVVar2[uVar9];
          if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
            pVVar11 = (VmValue *)0x0;
          }
          if (*(int *)(pVVar11[1].users.little + 7) == *(int *)(pVVar13[1].users.little + 7)) {
            ppVVar2[uVar9] = &pVVar6->super_VmValue;
            VmValue::RemoveUse(pVVar11,&p->super_VmValue);
            VmValue::AddUse(&pVVar6->super_VmValue,&p->super_VmValue);
          }
          uVar5 = uVar5 + 2;
          uVar9 = (p->arguments).count;
          uVar7 = (ulong)uVar9;
        } while (uVar5 < uVar9);
      }
    }
    uVar5 = (p->arguments).count;
  } while( true );
}

Assistant:

void SequentializeParallelCopy(VmModule *module, VmInstruction *p)
{
	while(!p->arguments.empty())
	{
		bool changed = false;

		// Handle leaf nodes
		for(unsigned argumentPos = 0; argumentPos < p->arguments.size();)
		{
			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			bool remove = false;

			// If the colors are the same, no need to move
			if(a->color != 0 && a->color == b->color)
			{
				ReplaceValueUsersWith(module, b, a, NULL);

				remove = true;
			}

			// If the target has no fixed register, extract as a move
			if(!remove && b->color == 0)
			{
				VmInstruction *copy = CreateMov(module, NULL, a->type, a);

				copy->comment = b->comment;

				ReplaceValueUsersWith(module, b, copy, NULL);

				remove = true;
			}

			// If the target fixed register value is not read by other copies, we can extract is as move
			if(!remove && b->color != 0)
			{
				bool isRead = false;

				for(unsigned k = 0; k < p->arguments.size(); k += 2)
				{
					VmInstruction *read = getType<VmInstruction>(p->arguments[k + 1]);

					if(read->color == b->color)
					{
						isRead = true;
						break;
					}
				}

				if(!isRead)
				{
					VmInstruction *copy = CreateMov(module, NULL, a->type, a);

					copy->color = b->color;
					copy->comment = b->comment;

					ReplaceValueUsersWith(module, b, copy, NULL);

					remove = true;
				}
			}

			if(remove)
			{
				p->arguments[argumentPos]->RemoveUse(p);
				p->arguments[argumentPos + 1]->RemoveUse(p);

				p->arguments[argumentPos + 1] = p->arguments.back();
				p->arguments.pop_back();

				p->arguments[argumentPos] = p->arguments.back();
				p->arguments.pop_back();

				changed = true;
			}
			else
			{
				argumentPos += 2;
			}
		}

		if(!changed)
		{
			// Take the first copy to break the loop
			unsigned argumentPos = 0;

			VmInstruction *b = getType<VmInstruction>(p->arguments[argumentPos]);
			VmInstruction *a = getType<VmInstruction>(p->arguments[argumentPos + 1]);

			// Find current destination user
			VmInstruction *user = NULL;

			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					user = a2;
					break;
				}
			}

			// Create a new location for A (uncolored!)
			VmInstruction *backup = CreateMov(module, NULL, user->type, user);

			backup->comment = user->comment;

			// Create a copy
			VmInstruction *copy = CreateMov(module, NULL, a->type, a);

			copy->color = b->color;
			copy->comment = b->comment;

			ReplaceValueUsersWith(module, b, copy, NULL);

			// Remove argument
			p->arguments[argumentPos]->RemoveUse(p);
			p->arguments[argumentPos + 1]->RemoveUse(p);

			p->arguments[argumentPos + 1] = p->arguments.back();
			p->arguments.pop_back();

			p->arguments[argumentPos] = p->arguments.back();
			p->arguments.pop_back();

			// Replace all uses of original color with a copy
			for(unsigned k = 0; k < p->arguments.size(); k += 2)
			{
				VmInstruction *a2 = getType<VmInstruction>(p->arguments[k + 1]);

				if(a2->color == b->color)
				{
					p->arguments[k + 1] = backup;

					a2->RemoveUse(p);
					backup->AddUse(p);
				}
			}
		}
	}
}